

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
ear::Layout::isLfe(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Layout *this)

{
  pointer pCVar1;
  pointer pCVar2;
  Channel local_b0;
  
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  pCVar1 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    Channel::Channel(&local_b0,pCVar2);
    std::vector<bool,_std::allocator<bool>_>::push_back(__return_storage_ptr__,local_b0._isLfe);
    Channel::~Channel(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> Layout::isLfe() const {
    std::vector<bool> isLfeMapping;
    std::transform(_channels.begin(), _channels.end(),
                   std::back_inserter(isLfeMapping),
                   [](Channel c) -> bool { return c.isLfe(); });
    return isLfeMapping;
  }